

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_constraint.hpp
# Opt level: O0

BoundNotNullConstraint * __thiscall
duckdb::BoundConstraint::Cast<duckdb::BoundNotNullConstraint>(BoundConstraint *this)

{
  string *msg;
  BoundNotNullConstraint *in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  if ((in_RDI->super_BoundConstraint).type != NOT_NULL) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"Failed to cast constraint to type - bound constraint type mismatch",this_00
              );
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE) {
			throw InternalException("Failed to cast constraint to type - bound constraint type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}